

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

Mesh * __thiscall
Rml::Geometry::Release(Mesh *__return_storage_ptr__,Geometry *this,ReleaseMode mode)

{
  pointer pVVar1;
  pointer piVar2;
  
  if ((this->
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ).resource_handle == Invalid) {
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    RenderManager::ReleaseResource
              (__return_storage_ptr__,
               (this->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).render_manager,this);
    (this->
    super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ).render_manager = (RenderManager *)0x0;
    (this->
    super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ).resource_handle = Invalid;
    if (mode == ClearMesh) {
      pVVar1 = (__return_storage_ptr__->vertices).
               super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->vertices).
          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
          super__Vector_impl_data._M_finish != pVVar1) {
        (__return_storage_ptr__->vertices).
        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar1;
      }
      piVar2 = (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar2) {
        (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar2;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh Geometry::Release(ReleaseMode mode)
{
	if (resource_handle == StableVectorIndex::Invalid)
		return Mesh();

	Mesh mesh = RenderManagerAccess::ReleaseResource(render_manager, *this);
	Clear();
	if (mode == ReleaseMode::ClearMesh)
	{
		mesh.vertices.clear();
		mesh.indices.clear();
	}
	return mesh;
}